

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadImpl.cpp
# Opt level: O1

void * efsw::Platform::ThreadImpl::entryPoint(void *userData)

{
  pthread_setcanceltype(1,(int *)0x0);
  (**(code **)(*userData + 0x18))(userData);
  return (void *)0x0;
}

Assistant:

void* ThreadImpl::entryPoint( void* userData ) {
// Tell the thread to handle cancel requests immediatly
#ifdef PTHREAD_CANCEL_ASYNCHRONOUS
	pthread_setcanceltype( PTHREAD_CANCEL_ASYNCHRONOUS, NULL );
#endif

	// The Thread instance is stored in the user data
	Thread* owner = static_cast<Thread*>( userData );

	// Forward to the owner
	owner->run();

	return NULL;
}